

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O2

Violation __thiscall
mp::SOS_1or2_Constraint<2>::
ComputeViolationSOS2<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (SOS_1or2_Constraint<2> *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  Violation VVar7;
  int local_34;
  
  uVar3 = (ulong)(int)((ulong)((long)(this->v_).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start) >> 2);
  local_34 = 1;
  uVar4 = 0xffffffffffffffff;
  iVar5 = 0;
  uVar2 = 0xffffffff;
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    bVar6 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::is_positive
                      (x,(this->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar3]);
    if (bVar6) {
      iVar5 = iVar5 + 1;
      if ((int)uVar4 < 0) {
        uVar4 = uVar3 & 0xffffffff;
      }
      else if ((int)uVar2 < 0) {
        uVar2 = uVar3 & 0xffffffff;
        local_34 = (int)uVar4 - (int)uVar3;
      }
    }
  }
  iVar1 = 2;
  if (2 < iVar5) {
    iVar1 = iVar5;
  }
  local_34 = 1 - local_34;
  iVar5 = -local_34;
  if (0 < local_34) {
    iVar5 = local_34;
  }
  VVar7.viol_ = (double)(iVar1 + iVar5 + -2);
  VVar7.valX_ = 0.0;
  return VVar7;
}

Assistant:

Violation ComputeViolationSOS2(const VarInfo& x) const {
    int npos=0, pos1=-1, pos2=-1;
    int posDist=1;     // should be 1
    for (int i=(int)v_.size(); i--; ) {
      if (x.is_positive(v_[i])) {
        ++npos;
        if (pos1<0)
          pos1=i;
        else if (pos2<0) {
          pos2=i;
          posDist = pos1-pos2;
        }
      }
    }
    return {double(std::max(0, npos-2)
        + std::abs(1 - posDist)), 0.0};
  }